

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O0

int ssh_cfg_info(Backend *be)

{
  Ssh *ssh;
  Backend *be_local;
  
  if (*(int *)&be[10].vt == 0) {
    be_local._4_4_ = 0;
  }
  else if (((ulong)be[4].vt & 1) == 0) {
    be_local._4_4_ = *(int *)&be[10].vt;
  }
  else {
    be_local._4_4_ = -1;
  }
  return be_local._4_4_;
}

Assistant:

static int ssh_cfg_info(Backend *be)
{
    Ssh *ssh = container_of(be, Ssh, backend);
    if (ssh->version == 0)
        return 0; /* don't know yet */
    else if (ssh->bare_connection)
        return -1;
    else
        return ssh->version;
}